

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int reparse_path_expr(ly_ctx *ctx,lyxp_expr *exp,uint16_t *exp_idx)

{
  uint16_t uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  char *pcVar8;
  uint uVar9;
  bool bVar10;
  char *local_50;
  char *local_40;
  uint local_34;
  
  uVar2 = *exp_idx;
  if (exp->used == uVar2) {
    ly_vlog(ctx,LYE_XPATH_EOF,LY_VLOG_NONE,(void *)0x0);
    return -1;
  }
  switch(exp->tokens[uVar2]) {
  case LYXP_TOKEN_PAR1:
    *exp_idx = uVar2 + 1;
    iVar4 = reparse_or_expr(ctx,exp,exp_idx);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = exp_check_token(ctx,exp,*exp_idx,LYXP_TOKEN_PAR2,1);
    if (iVar4 != 0) {
      return -1;
    }
    uVar2 = *exp_idx;
  case LYXP_TOKEN_LITERAL:
  case LYXP_TOKEN_NUMBER:
    *exp_idx = uVar2 + 1;
    goto LAB_00176c41;
  default:
    pcVar5 = print_token(exp->tokens[uVar2]);
    ly_vlog(ctx,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar5,exp->expr + exp->expr_pos[*exp_idx])
    ;
    return -1;
  case LYXP_TOKEN_DOT:
  case LYXP_TOKEN_DDOT:
  case LYXP_TOKEN_AT:
  case LYXP_TOKEN_NAMETEST:
  case LYXP_TOKEN_NODETYPE:
    goto switchD_00176bc2_caseD_5;
  case LYXP_TOKEN_FUNCNAME:
    iVar4 = exp_check_token(ctx,exp,uVar2,LYXP_TOKEN_FUNCNAME,1);
    if (iVar4 != 0) {
      return -1;
    }
    break;
  case LYXP_TOKEN_OPERATOR_PATH:
    iVar4 = exp_check_token(ctx,exp,uVar2,LYXP_TOKEN_OPERATOR_PATH,1);
    if (iVar4 != 0) {
      return -1;
    }
    uVar2 = *exp_idx + 1;
    uVar1 = exp->tok_len[*exp_idx];
    *exp_idx = uVar2;
    if (uVar1 == 1) {
      if (exp->used == uVar2) {
        return 0;
      }
      if (LYXP_TOKEN_NODETYPE < exp->tokens[uVar2]) {
        return 0;
      }
      if ((0x6e0U >> (exp->tokens[uVar2] & (LYXP_TOKEN_OPERATOR_PATH|LYXP_TOKEN_OPERATOR_UNI)) & 1)
          == 0) {
        return 0;
      }
    }
    iVar4 = reparse_relative_location_path(ctx,exp,exp_idx);
    goto LAB_00176bd8;
  }
  uVar2 = *exp_idx;
  uVar3 = *(ushort *)((long)exp->tok_len + (ulong)((uint)uVar2 * 2));
  pcVar5 = exp->expr;
  uVar6 = (ulong)*(ushort *)((long)exp->expr_pos + (ulong)((uint)uVar2 * 2));
  switch(uVar3) {
  case 3:
    if (pcVar5[uVar6] == 's') {
      if (pcVar5[uVar6 + 1] != 'u') goto switchD_00176d92_caseD_e;
      bVar10 = pcVar5[uVar6 + 2] == 'm';
    }
    else {
      if ((pcVar5[uVar6] != 'n') || (pcVar5[uVar6 + 1] != 'o')) goto switchD_00176d92_caseD_e;
      bVar10 = pcVar5[uVar6 + 2] == 't';
    }
    local_34 = 1;
    local_40._0_4_ = 1;
    if (!bVar10) goto switchD_00176d92_caseD_e;
    break;
  case 4:
    pcVar8 = pcVar5 + uVar6;
    iVar4 = strncmp(pcVar8,"lang",4);
    local_40._0_4_ = 1;
    if (iVar4 == 0) {
      local_34 = 1;
    }
    else {
      iVar4 = strncmp(pcVar8,"last",4);
      local_34 = 0;
      if (iVar4 == 0) {
LAB_00177248:
        local_34 = 0;
        local_40._0_4_ = 0;
      }
      else {
        iVar4 = strncmp(pcVar8,"name",4);
        if (iVar4 != 0) {
          iVar4 = strncmp(pcVar8,"true",4);
          local_40._0_4_ = 0;
          goto LAB_00176fbb;
        }
      }
    }
    break;
  case 5:
    pcVar8 = pcVar5 + uVar6;
    iVar4 = strncmp(pcVar8,"count",5);
    local_34 = 1;
    if (iVar4 != 0) {
      iVar4 = strncmp(pcVar8,"false",5);
      if (iVar4 == 0) goto LAB_00177248;
      iVar4 = strncmp(pcVar8,"floor",5);
      if ((iVar4 != 0) && (iVar4 = strncmp(pcVar8,"round",5), iVar4 != 0)) {
        iVar4 = strncmp(pcVar8,"deref",5);
        local_40._0_4_ = 1;
        goto LAB_00176fbb;
      }
    }
LAB_00177285:
    local_34 = 1;
    local_40._0_4_ = 1;
    break;
  case 6:
    iVar4 = strncmp(pcVar5 + uVar6,"concat",6);
    if (iVar4 == 0) {
LAB_00177231:
      local_40._0_4_ = 3;
      local_34 = 2;
    }
    else {
      iVar4 = strncmp(pcVar5 + uVar6,"number",6);
      local_40._0_4_ = 1;
      local_34 = 0;
      if (iVar4 != 0) {
        pcVar8 = "string";
        sVar7 = 6;
        goto LAB_00176fb2;
      }
    }
    break;
  case 7:
    pcVar8 = pcVar5 + uVar6;
    iVar4 = strncmp(pcVar8,"boolean",7);
    local_34 = 1;
    if (iVar4 == 0) goto LAB_00177285;
    iVar4 = strncmp(pcVar8,"ceiling",7);
    local_40._0_4_ = 1;
    if (iVar4 != 0) {
      iVar4 = strncmp(pcVar8,"current",7);
      if (iVar4 != 0) goto switchD_00176d92_caseD_e;
      goto LAB_00177248;
    }
    break;
  case 8:
    pcVar8 = pcVar5 + uVar6;
    iVar4 = strncmp(pcVar8,"contains",8);
    local_34 = 2;
    if (iVar4 != 0) {
      iVar4 = strncmp(pcVar8,"position",8);
      if (iVar4 == 0) goto LAB_00177248;
      iVar4 = strncmp(pcVar8,"re-match",8);
      local_40._0_4_ = 2;
LAB_00176fbb:
      if (iVar4 != 0) goto switchD_00176d92_caseD_e;
      break;
    }
    goto LAB_00177218;
  case 9:
    iVar4 = strncmp(pcVar5 + uVar6,"substring",9);
    if (iVar4 == 0) goto LAB_00177231;
    iVar4 = strncmp(pcVar5 + uVar6,"translate",9);
    if (iVar4 != 0) goto switchD_00176d92_caseD_e;
    local_34 = 3;
    local_40._0_4_ = 3;
    break;
  case 10:
    iVar4 = strncmp(pcVar5 + uVar6,"local-name",10);
    if (iVar4 != 0) {
      iVar4 = strncmp(pcVar5 + uVar6,"enum-value",10);
      if (iVar4 != 0) {
        pcVar8 = "bit-is-set";
        sVar7 = 10;
        goto LAB_001771a5;
      }
      goto LAB_00177285;
    }
LAB_00177221:
    local_40._0_4_ = 1;
    local_34 = 0;
    break;
  case 0xb:
    pcVar8 = "starts-with";
    sVar7 = 0xb;
    goto LAB_001771e2;
  case 0xc:
    pcVar8 = "derived-from";
    sVar7 = 0xc;
    goto LAB_001771e2;
  case 0xd:
    iVar4 = strncmp(pcVar5 + uVar6,"namespace-uri",0xd);
    local_40._0_4_ = 1;
    local_34 = 0;
    if (iVar4 != 0) {
      pcVar8 = "string-length";
      sVar7 = 0xd;
LAB_00176fb2:
      local_50 = pcVar5 + uVar6;
      local_34 = 0;
      local_40._0_4_ = 1;
      iVar4 = strncmp(local_50,pcVar8,sVar7);
      goto LAB_00176fbb;
    }
    break;
  default:
    goto switchD_00176d92_caseD_e;
  case 0xf:
    iVar4 = strncmp(pcVar5 + uVar6,"normalize-space",0xf);
    if (iVar4 == 0) goto LAB_00177221;
    pcVar8 = "substring-after";
    sVar7 = 0xf;
LAB_001771a5:
    local_40 = pcVar5 + uVar6;
    iVar4 = strncmp(local_40,pcVar8,sVar7);
    goto joined_r0x001771ed;
  case 0x10:
    pcVar8 = "substring-before";
    sVar7 = 0x10;
    goto LAB_001771e2;
  case 0x14:
    pcVar8 = "derived-from-or-self";
    sVar7 = 0x14;
LAB_001771e2:
    iVar4 = strncmp(pcVar5 + uVar6,pcVar8,sVar7);
joined_r0x001771ed:
    if (iVar4 != 0) {
switchD_00176d92_caseD_e:
      ly_vlog(ctx,LYE_XPATH_INFUNC,LY_VLOG_NONE,(void *)0x0,(ulong)uVar3,pcVar5 + uVar6);
      return -1;
    }
LAB_00177218:
    local_34 = 2;
    local_40._0_4_ = 2;
  }
  *exp_idx = uVar2 + 1;
  iVar4 = exp_check_token(ctx,exp,uVar2 + 1,LYXP_TOKEN_PAR1,1);
  if (iVar4 != 0) {
    return -1;
  }
  uVar3 = *exp_idx + 1;
  *exp_idx = uVar3;
  if (exp->used == uVar3) {
    ly_vlog(ctx,LYE_XPATH_EOF,LY_VLOG_NONE,(void *)0x0);
    return -1;
  }
  uVar9 = 0;
  if (exp->tokens[uVar3] != LYXP_TOKEN_PAR2) {
    iVar4 = reparse_or_expr(ctx,exp,exp_idx);
    if (iVar4 != 0) {
      return -1;
    }
    uVar9 = 1;
  }
  while( true ) {
    uVar3 = *exp_idx;
    if ((exp->used <= uVar3) || (exp->tokens[uVar3] != LYXP_TOKEN_COMMA)) break;
    *exp_idx = uVar3 + 1;
    uVar9 = uVar9 + 1;
    iVar4 = reparse_or_expr(ctx,exp,exp_idx);
    if (iVar4 != 0) {
      return -1;
    }
  }
  iVar4 = exp_check_token(ctx,exp,uVar3,LYXP_TOKEN_PAR2,1);
  if (iVar4 != 0) {
    return -1;
  }
  *exp_idx = *exp_idx + 1;
  if (uVar9 < local_34 || (uint)local_40 < uVar9) {
    ly_vlog(ctx,LYE_XPATH_INARGCOUNT,LY_VLOG_NONE,(void *)0x0,(ulong)uVar9,
            (ulong)*(ushort *)((long)exp->tok_len + (ulong)((uint)uVar2 * 2)),
            exp->expr + *(ushort *)((long)exp->expr_pos + (ulong)((uint)uVar2 * 2)));
    return -1;
  }
LAB_00176c41:
  while( true ) {
    uVar2 = *exp_idx;
    if (exp->used <= uVar2) {
      return 0;
    }
    if (exp->tokens[uVar2] != LYXP_TOKEN_BRACK1) break;
    iVar4 = reparse_predicate(ctx,exp,exp_idx);
    if (iVar4 != 0) {
      return -1;
    }
  }
  if (exp->tokens[uVar2] != LYXP_TOKEN_OPERATOR_PATH) {
    return 0;
  }
  *exp_idx = uVar2 + 1;
switchD_00176bc2_caseD_5:
  iVar4 = reparse_relative_location_path(ctx,exp,exp_idx);
LAB_00176bd8:
  if (iVar4 == 0) {
    return 0;
  }
  return -1;
}

Assistant:

static int
reparse_path_expr(struct ly_ctx *ctx, struct lyxp_expr *exp, uint16_t *exp_idx)
{
    if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
        return -1;
    }

    switch (exp->tokens[*exp_idx]) {
    case LYXP_TOKEN_PAR1:
        /* '(' Expr ')' Predicate* */
        ++(*exp_idx);

        if (reparse_or_expr(ctx, exp, exp_idx)) {
            return -1;
        }

        if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_PAR2, 1)) {
            return -1;
        }
        ++(*exp_idx);
        goto predicate;
        break;
    case LYXP_TOKEN_DOT:
    case LYXP_TOKEN_DDOT:
    case LYXP_TOKEN_AT:
    case LYXP_TOKEN_NAMETEST:
    case LYXP_TOKEN_NODETYPE:
        /* RelativeLocationPath */
        if (reparse_relative_location_path(ctx, exp, exp_idx)) {
            return -1;
        }
        break;
    case LYXP_TOKEN_FUNCNAME:
        /* FunctionCall */
        if (reparse_function_call(ctx, exp, exp_idx)) {
            return -1;
        }
        goto predicate;
        break;
    case LYXP_TOKEN_OPERATOR_PATH:
        /* AbsoluteLocationPath */
        if (reparse_absolute_location_path(ctx, exp, exp_idx)) {
            return -1;
        }
        break;
    case LYXP_TOKEN_LITERAL:
        /* Literal */
        ++(*exp_idx);
        goto predicate;
        break;
    case LYXP_TOKEN_NUMBER:
        /* Number */
        ++(*exp_idx);
        goto predicate;
        break;
    default:
        LOGVAL(ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
               print_token(exp->tokens[*exp_idx]), &exp->expr[exp->expr_pos[*exp_idx]]);
        return -1;
    }

    return EXIT_SUCCESS;

predicate:
    /* Predicate* */
    while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
        if (reparse_predicate(ctx, exp, exp_idx)) {
            return -1;
        }
    }

    /* ('/' or '//') RelativeLocationPath */
    if ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH)) {

        /* '/' or '//' */
        ++(*exp_idx);

        if (reparse_relative_location_path(ctx, exp, exp_idx)) {
            return -1;
        }
    }

    return EXIT_SUCCESS;
}